

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  StructUnionTypeSyntax *pSVar1;
  Token *unaff_RBX;
  SyntaxList<slang::syntax::StructUnionMemberSyntax> *unaff_retaddr;
  Token *in_stack_00000008;
  Token *in_stack_00000010;
  SyntaxKind *in_stack_00000018;
  BumpAllocator *in_stack_00000020;
  Token *in_stack_00000050;
  SyntaxList<slang::syntax::StructUnionMemberSyntax> *in_stack_00000058;
  Token *in_stack_00000060;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_stack_00000068;
  BumpAllocator *in_stack_00000098;
  Token *in_stack_000000a0;
  
  parsing::Token::deepClone(in_stack_000000a0,in_stack_00000098);
  parsing::Token::deepClone(in_stack_000000a0,in_stack_00000098);
  parsing::Token::deepClone(in_stack_000000a0,in_stack_00000098);
  parsing::Token::deepClone(in_stack_000000a0,in_stack_00000098);
  parsing::Token::deepClone(in_stack_000000a0,in_stack_00000098);
  deepClone<slang::syntax::StructUnionMemberSyntax>(unaff_retaddr,(BumpAllocator *)unaff_RBX);
  parsing::Token::deepClone(in_stack_000000a0,in_stack_00000098);
  deepClone<slang::syntax::VariableDimensionSyntax>
            ((SyntaxList<slang::syntax::VariableDimensionSyntax> *)unaff_retaddr,
             (BumpAllocator *)unaff_RBX);
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::StructUnionTypeSyntax,slang::syntax::SyntaxKind_const&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::StructUnionMemberSyntax>&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>&>
                     (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                      (Token *)unaff_retaddr,unaff_RBX,in_stack_00000050,in_stack_00000058,
                      in_stack_00000060,in_stack_00000068);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const StructUnionTypeSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<StructUnionTypeSyntax>(
        node.kind,
        node.keyword.deepClone(alloc),
        node.taggedOrSoft.deepClone(alloc),
        node.packed.deepClone(alloc),
        node.signing.deepClone(alloc),
        node.openBrace.deepClone(alloc),
        *deepClone(node.members, alloc),
        node.closeBrace.deepClone(alloc),
        *deepClone(node.dimensions, alloc)
    );
}